

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# localizer.cpp
# Opt level: O0

void __thiscall
ary::PlanarLocalization::draw(PlanarLocalization *this,Mat *image,SharedCameraModel *model)

{
  ulong uVar1;
  size_type sVar2;
  Scalar_<double> local_c8;
  Point_ local_a8 [8];
  Point_ local_a0 [8];
  _InputOutputArray local_98;
  Scalar_<double> local_80;
  Point_ local_5c [20];
  Point_ local_48 [8];
  _InputOutputArray local_40;
  int local_24;
  SharedCameraModel *pSStack_20;
  int i;
  SharedCameraModel *model_local;
  Mat *image_local;
  PlanarLocalization *this_local;
  
  local_24 = 1;
  pSStack_20 = model;
  model_local = (SharedCameraModel *)image;
  image_local = (Mat *)this;
  while( true ) {
    uVar1 = (ulong)local_24;
    sVar2 = std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::size
                      (&this->corners);
    if (sVar2 <= uVar1) break;
    cv::_InputOutputArray::_InputOutputArray(&local_40,(Mat *)model_local);
    std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::operator[]
              (&this->corners,(long)(local_24 + -1));
    cv::Point_::operator_cast_to_Point_(local_48);
    std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::operator[]
              (&this->corners,(long)local_24);
    cv::Point_::operator_cast_to_Point_(local_5c);
    cv::Scalar_<double>::Scalar_(&local_80,0.0,255.0,0.0,0.0);
    cv::line(&local_40,local_48,local_5c,&local_80,4,8,0);
    cv::_InputOutputArray::~_InputOutputArray(&local_40);
    local_24 = local_24 + 1;
  }
  cv::_InputOutputArray::_InputOutputArray(&local_98,(Mat *)model_local);
  sVar2 = std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::size(&this->corners);
  std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::operator[]
            (&this->corners,sVar2 - 1);
  cv::Point_::operator_cast_to_Point_(local_a0);
  std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::operator[](&this->corners,0);
  cv::Point_::operator_cast_to_Point_(local_a8);
  cv::Scalar_<double>::Scalar_(&local_c8,0.0,255.0,0.0,0.0);
  cv::line(&local_98,local_a0,local_a8,&local_c8,4,8,0);
  cv::_InputOutputArray::~_InputOutputArray(&local_98);
  Localization::draw(&this->super_Localization,(Mat *)model_local,pSStack_20);
  return;
}

Assistant:

void PlanarLocalization::draw(cv::Mat& image, SharedCameraModel& model) const {


    for (int i = 1; i < corners.size(); i++) {
	    line(image, corners[i-1], corners[i], Scalar(0, 255, 0), 4);
    }
    line(image, corners[corners.size()-1], corners[0], Scalar(0, 255, 0), 4);

    Localization::draw(image, model);

}